

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O2

void Wlc_NtkFindOneNode(Wlc_Ntk_t *p,Wlc_Obj_t *pWlcObj,Gia_Man_t *pGia,Vec_Mem_t *vTtMem)

{
  int nWords;
  uint uVar1;
  Wlc_Obj_t *pWVar2;
  uint uVar3;
  int iVar4;
  int Lit;
  int iVar5;
  int iVar6;
  uint uVar7;
  word *pOut;
  uint *puVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  
  nWords = vTtMem->nEntrySize;
  uVar3 = pWlcObj->End - pWlcObj->Beg;
  uVar10 = -uVar3;
  if (0 < (int)uVar3) {
    uVar10 = uVar3;
  }
  iVar4 = Vec_IntEntry(&p->vCopies,(int)(((long)pWlcObj - (long)p->pObjs) / 0x18));
  uVar12 = 0;
  while (uVar3 = (uint)uVar12, uVar3 <= uVar10) {
    Lit = Vec_IntEntry(&p->vBits,iVar4 + uVar3);
    iVar5 = Abc_Lit2Var(Lit);
    pOut = Wlc_ObjSim(pGia,iVar5);
    uVar11 = (uint)*pOut & 1;
    if (uVar11 != 0) {
      Abc_TtNot(pOut,nWords);
    }
    puVar8 = (uint *)Vec_MemHashLookup(vTtMem,pOut);
    uVar1 = *puVar8;
    if (0 < (int)uVar1) {
      pWVar2 = p->pObjs;
      iVar6 = pWlcObj->End - pWlcObj->Beg;
      iVar5 = -iVar6;
      if (0 < iVar6) {
        iVar5 = iVar6;
      }
      uVar7 = Abc_LitIsCompl(Lit);
      pcVar9 = Wlc_ObjName(p,(int)(((long)pWlcObj - (long)p->pObjs) / 0x18));
      printf("Obj %4d.  Range = %2d.  Bit %2d.  Entry %d(%d).  %s\n",
             ((long)pWlcObj - (long)pWVar2) / 0x18,(ulong)(iVar5 + 1),uVar12,(ulong)uVar1,
             (ulong)(uVar7 ^ uVar11),pcVar9);
    }
    if (uVar11 != 0) {
      Abc_TtNot(pOut,nWords);
    }
    uVar12 = (ulong)(uVar3 + 1);
  }
  return;
}

Assistant:

void Wlc_NtkFindOneNode( Wlc_Ntk_t * p, Wlc_Obj_t * pWlcObj, Gia_Man_t * pGia, Vec_Mem_t * vTtMem )
{
    int k, Entry;
    int nWords = Vec_MemEntrySize(vTtMem);
    int nBits = Wlc_ObjRange(pWlcObj);
    int iFirst = Vec_IntEntry( &p->vCopies, Wlc_ObjId(p, pWlcObj) );
    for ( k = 0; k < nBits; k++ )
    {
        int iLit = Vec_IntEntry( &p->vBits, iFirst + k );
        word * pInfoObj = Wlc_ObjSim( pGia, Abc_Lit2Var(iLit) );
        int fCompl = pInfoObj[0] & 1;
        if ( fCompl ) Abc_TtNot( pInfoObj, nWords );
        Entry = *Vec_MemHashLookup( vTtMem, pInfoObj );
        if ( Entry > 0 )
            printf( "Obj %4d.  Range = %2d.  Bit %2d.  Entry %d(%d).  %s\n", Wlc_ObjId(p, pWlcObj), Wlc_ObjRange(pWlcObj), k, Entry, fCompl ^ Abc_LitIsCompl(iLit), Wlc_ObjName(p, Wlc_ObjId(p, pWlcObj)) );
        if ( fCompl ) Abc_TtNot( pInfoObj, nWords );
        //printf( "%2d ", Entry );
        //Extra_PrintHex( stdout, (unsigned*)pInfoObj, 8 );
        //printf( "\n" );
    }
    //printf( "\n" );
}